

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printJPG(JPG *jpg)

{
  uint uVar1;
  MCU *pMVar2;
  Block *paiVar3;
  uint uVar4;
  ostream *poVar5;
  Block **ppaiVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint q;
  long lVar10;
  ulong uVar11;
  uint ID;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  pointer pSVar15;
  uint i;
  
  poVar5 = std::operator<<((ostream *)&std::cout,"width:");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,"height:");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"\n");
  for (lVar9 = 1; lVar9 != 4; lVar9 = lVar9 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ComponentID:");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"\n");
    for (uVar7 = 0; uVar7 < jpg->mcuHeight; uVar7 = uVar7 + 1) {
      for (uVar13 = 0; uVar1 = jpg->mcuWidth, uVar13 < uVar1; uVar13 = uVar13 + 1) {
        pMVar2 = jpg->data;
        poVar5 = std::operator<<((ostream *)&std::cout,"muc Row:");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," mcu column:");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::operator<<(poVar5,"\n");
        uVar11 = 0;
        while( true ) {
          ID = (uint)lVar9;
          uVar4 = JPG::getVerticalSamplingFrequency(jpg,ID);
          if (uVar4 <= uVar11) break;
          uVar12 = 0;
          while( true ) {
            uVar4 = JPG::getHorizontalSamplingFrequency(jpg,ID);
            if (uVar4 <= uVar12) break;
            poVar5 = std::operator<<((ostream *)&std::cout,"Block row:");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5," Block column:");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5,"\n");
            ppaiVar6 = MCU::operator[](pMVar2 + (uVar1 * (int)uVar7 + (int)uVar13),ID);
            paiVar3 = *ppaiVar6;
            uVar4 = JPG::getHorizontalSamplingFrequency(jpg,ID);
            piVar14 = paiVar3[uVar4 * (int)uVar11 + (int)uVar12];
            for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
              for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
                poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar14[lVar10]);
                std::operator<<(poVar5," ");
              }
              std::operator<<((ostream *)&std::cout,"\n");
              piVar14 = piVar14 + 8;
            }
            uVar12 = uVar12 + 1;
          }
          uVar11 = uVar11 + 1;
        }
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"DC Tables 0 ");
  std::operator<<(poVar5,"\n");
  for (uVar7 = 1; uVar7 != 0x11; uVar7 = uVar7 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"length:");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,":::");
    for (pSVar15 = (jpg->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar15 !=
        (jpg->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar15 = pSVar15 + 1) {
      if (uVar7 == pSVar15->codeLength) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar5,"  ");
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"DC Tables 1 ");
  std::operator<<(poVar5,"\n");
  for (uVar7 = 1; uVar7 != 0x11; uVar7 = uVar7 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"length:");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,":::");
    for (pSVar15 = (jpg->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar15 !=
        (jpg->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar15 = pSVar15 + 1) {
      if (uVar7 == pSVar15->codeLength) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar5,"  ");
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"AC Tables 0 ");
  std::operator<<(poVar5,"\n");
  for (uVar7 = 1; uVar7 != 0x11; uVar7 = uVar7 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"length:");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,":::");
    for (pSVar15 = (jpg->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar15 !=
        (jpg->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar15 = pSVar15 + 1) {
      if (uVar7 == pSVar15->codeLength) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar5,"  ");
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"AC Tables 1 ");
  std::operator<<(poVar5,"\n");
  for (uVar7 = 1; uVar7 != 0x11; uVar7 = uVar7 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"length:");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,":::");
    for (pSVar15 = (jpg->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pSVar15 !=
        (jpg->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
        super__Vector_impl_data._M_finish; pSVar15 = pSVar15 + 1) {
      if (uVar7 == pSVar15->codeLength) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar5,"  ");
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  return;
}

Assistant:

void printJPG(const JPG& jpg) {
    std::cout << "width:" << jpg.width << " " << "height:" << jpg.height << "\n";
    for (uint componentID = 1; componentID <= 3; componentID++) {
        std::cout << "ComponentID:" << componentID << "\n";
        for (uint i = 0; i < jpg.mcuHeight; i++) {
            for (uint j = 0; j < jpg.mcuWidth; j++) {
                MCU& mcu = jpg.data[i * jpg.mcuWidth + j];
                std::cout << "muc Row:" << i << " mcu column:" << j << "\n";
                for (uint ii = 0; ii < jpg.getVerticalSamplingFrequency(componentID); ii++) {
                    for (uint jj = 0; jj < jpg.getHorizontalSamplingFrequency(componentID); jj++) {
                        std::cout << "Block row:" << ii << " Block column:" << jj << "\n";
                        Block& block = mcu[componentID][ii * jpg.getHorizontalSamplingFrequency(componentID) + jj];
                        for(uint k = 0; k < 8; k++) {
                            for(uint q = 0; q < 8; q++) {
                                std::cout << block[k * 8 + q] << " ";
                            }
                            std::cout << "\n";
                        }
                    }
                }
            }
        }
    }
    std::cout << "DC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yDC.sortedSymbol.cbegin(); it != jpg.yDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "DC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaDC.sortedSymbol.cbegin(); it != jpg.chromaDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";

    }
    std::cout << "AC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yAC.sortedSymbol.cbegin(); it != jpg.yAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "AC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaAC.sortedSymbol.cbegin(); it != jpg.chromaAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
}